

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

int __thiscall CTcSymEnumBase::write_to_sym_file(CTcSymEnumBase *this,CVmFile *fp)

{
  byte local_38 [40];
  
  CTcSymbolBase::write_to_file_gen((CTcSymbolBase *)this,fp);
  local_38[0] = this->field_0x30 & 1;
  CVmFile::write_bytes(fp,(char *)local_38,1);
  return 1;
}

Assistant:

int CTcSymEnumBase::write_to_sym_file(CVmFile *fp)
{
    int result;
    char buf[32];

    /* inherit default */
    result =  CTcSymbol::write_to_sym_file(fp);

    /* write the 'token' flag */
    if (result)
    {
        /* clear the flags */
        buf[0] = 0;

        /* set the 'token' flag if appropriate */
        if (is_token_)
            buf[0] |= 1;

        /* write the flags */
        fp->write_bytes(buf, 1);
    }

    /* return the result */
    return result;
}